

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O0

void __thiscall verilogAST::Attribute::Attribute(Attribute *this,Attribute *rhs)

{
  anon_class_1_0_00000001 local_19;
  Attribute *local_18;
  Attribute *rhs_local;
  Attribute *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  Expression::Expression(&this->super_Expression);
  (this->super_Expression).super_Node._vptr_Node = (_func_int **)&PTR_toString_abi_cxx11__0031d4e8;
  std::
  visit<verilogAST::Attribute::Attribute(verilogAST::Attribute_const&)::_lambda(auto:1&&)_1_,std::variant<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Attribute,std::default_delete<verilogAST::Attribute>>>const&>
            (&this->value,&local_19,&local_18->value);
  std::__cxx11::string::string((string *)&this->attr,(string *)&local_18->attr);
  return;
}

Assistant:

Attribute(const Attribute& rhs)
      : value(std::visit(
            [](auto&& val) -> std::variant<std::unique_ptr<Identifier>,
                                           std::unique_ptr<Attribute>> {
              return val->clone();
            },
            rhs.value)),
        attr(rhs.attr){}